

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svwaitdown.c
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  char **ppcVar2;
  char **ppcVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  ssize_t sVar12;
  int *piVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  unsigned_long sec;
  ulong local_60;
  tai now;
  tai start;
  char status [20];
  
  sec = 600;
  progname = *argv;
  iVar4 = 0;
  bVar7 = true;
  bVar5 = false;
LAB_001022ca:
  while (iVar8 = sgetoptmine(argc,argv,"t:xkvV"), iVar8 != subgetoptdone) {
    if (iVar8 == 0x3f) goto LAB_00102344;
    if (iVar8 == 0x56) {
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
      goto LAB_00102344;
    }
    if (iVar8 == 0x74) goto LAB_00102308;
    if (iVar8 == 0x6b) {
      bVar7 = false;
    }
    else if (iVar8 == 0x76) {
      bVar5 = true;
    }
    else if (iVar8 == 0x78) {
      iVar4 = 1;
    }
  }
  lVar16 = (long)subgetoptind;
  if (argv[lVar16] == (char *)0x0) {
    usage();
  }
  iVar8 = open_read(".");
  if (iVar8 == -1) {
    fatal("unable to open current working directory");
  }
  local_60 = (ulong)(iVar4 + 1);
  ppcVar3 = argv + lVar16;
  for (dir = ppcVar3; *dir != (char *)0x0; dir = dir + 1) {
    if ((dir != ppcVar3) && (iVar9 = fchdir(iVar8), iVar9 == -1)) {
      fatal("unable to switch to starting directory");
    }
    iVar9 = chdir(*dir);
    if ((iVar9 != -1) && (iVar9 = open_write("supervise/control"), iVar9 != -1)) {
      write(iVar9,"dx",local_60);
      close(iVar9);
    }
  }
  dir = ppcVar3;
  tai_now(&start);
LAB_0010244f:
  do {
    pcVar14 = *dir;
    iVar9 = fchdir(iVar8);
    if (pcVar14 == (char *)0x0) {
      if (iVar9 == -1) {
        strerr_warn("svwaitdown: warning: ","unable to switch to starting directory: ",(char *)0x0,
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      }
      close(iVar8);
      if (100 < rc) {
        rc = 100;
      }
      _exit(rc);
    }
    if (iVar9 == -1) {
      fatal("unable to switch to starting directory");
    }
    iVar9 = chdir(*dir);
    if (iVar9 == -1) {
LAB_0010272e:
      pcVar14 = *dir;
      pcVar15 = ": unable to change directory: ";
      goto LAB_0010273f;
    }
    iVar9 = open_write("supervise/ok");
    if (iVar9 == -1) {
      piVar13 = __errno_location();
      if (*piVar13 != error_nodevice) {
        pcVar14 = *dir;
        pcVar15 = ": unable to open supervise/ok: ";
        goto LAB_0010273f;
      }
LAB_00102523:
      if (bVar5) {
        pcVar14 = *dir;
        pcVar15 = ": runsv not running.";
LAB_00102593:
        strerr_warn("svwaitdown: ",pcVar14,pcVar15,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0
                   );
      }
LAB_001025a0:
      dir = dir + 1;
      goto LAB_0010244f;
    }
    close(iVar9);
    iVar9 = open_read("supervise/status");
    if (iVar9 == -1) {
      pcVar14 = *dir;
      pcVar15 = "unable to open supervise/status: ";
LAB_0010273f:
      warn(pcVar14,pcVar15,&strerr_sys);
    }
    else {
      iVar10 = buffer_unixread(iVar9,status,0x14);
      close(iVar9);
      if (iVar10 < 0x12 || iVar10 == 0x13) {
        pcVar14 = *dir;
        if (iVar10 == -1) {
          pcVar15 = "unable to read supervise/status: ";
          goto LAB_0010273f;
        }
        warn(pcVar14,": unable to read supervise/status: bad format.",(strerr *)0x0);
      }
      else {
        if ((iVar4 == 0) && (status._12_4_ == 0)) {
          if (bVar5) {
            pcVar14 = *dir;
            pcVar15 = ": down.";
            goto LAB_00102593;
          }
          goto LAB_001025a0;
        }
        if (status[0x11] == 'd') {
LAB_00102607:
          tai_now(&now);
          tai_sub(&now,&now,&start);
          if (((double)CONCAT44(0x45300000,(int)(sec >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sec) - 4503599627370496.0) <=
              ((double)CONCAT44(0x45300000,(int)(now.x >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)now.x) - 4503599627370496.0)) {
            if (bVar5) {
              strerr_warn("svwaitdown: ","timeout.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                          (strerr *)0x0);
            }
            if (bVar7) goto LAB_001027d5;
            iVar9 = chdir(*dir);
            if (iVar9 == -1) goto LAB_0010272e;
            iVar9 = open_write("supervise/control");
            if (iVar9 == -1) {
              piVar13 = __errno_location();
              if (*piVar13 == error_nodevice) goto LAB_00102523;
              pcVar14 = *ppcVar3;
              goto LAB_00102756;
            }
            sVar12 = write(iVar9,"k",1);
            if (sVar12 == 1) {
              strerr_warn("svwaitdown: ",*dir,": killed.",(char *)0x0,(char *)0x0,(char *)0x0,
                          (strerr *)0x0);
            }
            else {
              warn(*ppcVar3,": unable to write to supervise/control: ",&strerr_sys);
            }
            close(iVar9);
            ppcVar1 = dir + 1;
            ppcVar2 = dir + 1;
            dir = ppcVar1;
            if (*ppcVar2 == (char *)0x0) {
LAB_001027d5:
              _exit(0x6f);
            }
          }
          else {
            sleep(1);
          }
        }
        else {
          iVar9 = open_write("supervise/control");
          uVar6 = local_60;
          if (iVar9 == -1) {
            pcVar14 = *dir;
LAB_00102756:
            pcVar15 = ": unable to open supervise/control: ";
            goto LAB_0010273f;
          }
          sVar11 = write(iVar9,"dx",local_60);
          if (sVar11 == uVar6) {
            close(iVar9);
            goto LAB_00102607;
          }
          warn(*dir,": unable to write to supervise/control: ",&strerr_sys);
          close(iVar9);
        }
      }
    }
  } while( true );
LAB_00102308:
  scan_ulong(subgetoptarg,&sec);
  if (sec - 0x1771 < 0xffffffffffffe890) {
LAB_00102344:
    usage();
  }
  goto LAB_001022ca;
}

Assistant:

int main(int argc, const char * const *argv) {
  int opt;
  unsigned long sec =600;
  int verbose =0;
  int doexit =0;
  int dokill =0;
  int wdir;
  int fd;
  char status[20];
  int r;
  unsigned long pid;
  struct tai start;
  struct tai now;

  progname =*argv;

  while ((opt =getopt(argc, argv, "t:xkvV")) != opteof) {
    switch(opt) {
    case 't':
      scan_ulong(optarg, &sec);
      if ((sec < 1) || (sec > 6000)) usage();
      break;
    case 'x':
      doexit =1;
      break;
    case 'k':
      dokill =1;
      break;
    case 'v':
      verbose =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");

  for (dir =argv; *dir; ++dir) {
    if (dir != argv)
      if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) continue; /* bummer */
    if ((fd =open_write("supervise/control")) == -1) continue; /* bummer */
    if (write(fd, "dx", 1 +doexit) != (1 +doexit)) {
      close(fd); continue; /* bummer */
    }
    close(fd);
  }
  dir =argv;

  tai_now(&start);
  while (*dir) {
    if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) {
      warn(*dir, ": unable to change directory: ", &strerr_sys);
      continue;
    }
    if ((fd =open_write("supervise/ok")) == -1) {
      if (errno == error_nodevice) {
        if (verbose) strerr_warn3(INFO, *dir, ": runsv not running.", 0);
        dir++;
      }
      else
        warn(*dir, ": unable to open supervise/ok: ", &strerr_sys);
      continue;
    }
    close(fd);

    if ((fd =open_read("supervise/status")) == -1) {
      warn(*dir, "unable to open supervise/status: ", &strerr_sys);
      continue;
    }
    r =buffer_unixread(fd, status, 20);
    close(fd);
    if ((r < 18) || (r == 19)) { /* supervise compatibility */
      if (r == -1)
        warn(*dir, "unable to read supervise/status: ", &strerr_sys);
      else
        warn(*dir, ": unable to read supervise/status: bad format.", 0);
      continue;
    }
    pid =(unsigned char)status[15];
    pid <<=8; pid +=(unsigned char)status[14];
    pid <<=8; pid +=(unsigned char)status[13];
    pid <<=8; pid +=(unsigned char)status[12];

    if (! doexit && ! pid) {
      /* ok, service is down */
      if (verbose) strerr_warn3(INFO, *dir, ": down.", 0);
      dir++;
      continue;
    }

    if (status[17] != 'd') { /* catch previous failures */
      if ((fd =open_write("supervise/control")) == -1) {
        warn(*dir, ": unable to open supervise/control: ", &strerr_sys);
        continue;
      }
      if (write(fd, "dx", 1 +doexit) != (1 +doexit)) {
        warn(*dir, ": unable to write to supervise/control: ", &strerr_sys);
        close(fd);
        continue;
      }
      close(fd);
    }

    tai_now(&now);
    tai_sub(&now, &now, &start);
    if (tai_approx(&now) >= sec) {
      /* timeout */
      if (verbose) strerr_warn2(INFO, "timeout.", 0);
      if (dokill) {
        if (chdir(*dir) == -1) {
          warn(*dir, ": unable to change directory: ", &strerr_sys);
          continue;
        }
        if ((fd =open_write("supervise/control")) == -1) {
          if (errno == error_nodevice) {
            if (verbose)
              strerr_warn3(INFO, *dir, ": runsv not running.", 0);
            dir++;
          }
          else
            warn(*argv, ": unable to open supervise/control: ", &strerr_sys);
          continue;
        }
        if (write(fd, "k", 1) != 1)
          warn(*argv, ": unable to write to supervise/control: ", &strerr_sys);
        else
          strerr_warn3(INFO, *dir, ": killed.", 0);
        close(fd);
        dir++;
        if (! *dir) _exit(111);
        continue;
      }
      _exit(111);
    }
    sleep(1);
  }
  if (fchdir(wdir) == -1)
    strerr_warn2(WARN, "unable to switch to starting directory: ", &strerr_sys);
  close(wdir);
  if (rc > 100) rc =100;
  _exit(rc);
}